

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::BinaryWriter::WriteMemory(BinaryWriter *this,Memory *memory)

{
  uint32_t uVar1;
  Stream *stream;
  uint8_t value;
  
  uVar1 = memory->page_size;
  WriteLimitsFlags(this->stream_,
                   (uint)(memory->page_limits).has_max + (uint)(memory->page_limits).is_shared * 2 +
                   (uint)(memory->page_limits).is_64 * 4 + (uint)(uVar1 != 0x10000) * 8);
  WriteLimitsData(this->stream_,&memory->page_limits);
  if (uVar1 == 0x10000) {
    return;
  }
  stream = this->stream_;
  value = log2_u32(memory->page_size);
  WriteU32Leb128<unsigned_char>(stream,value,"memory page size");
  return;
}

Assistant:

void BinaryWriter::WriteMemory(const Memory* memory) {
  uint32_t flags = ComputeLimitsFlags(&memory->page_limits);
  const bool custom_page_size = memory->page_size != WABT_DEFAULT_PAGE_SIZE;
  flags |= custom_page_size ? WABT_BINARY_LIMITS_HAS_CUSTOM_PAGE_SIZE_FLAG : 0;
  WriteLimitsFlags(stream_, flags);
  WriteLimitsData(stream_, &memory->page_limits);
  if (custom_page_size) {
    WriteU32Leb128(stream_, log2_u32(memory->page_size), "memory page size");
  }
}